

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::EasyHandle::Close(EasyHandle *this)

{
  ostream *poVar1;
  
  if (this->handle_ != (handle_t)0x0) {
    poVar1 = std::operator<<((ostream *)&std::clog,"Cleaning easy-handle ");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    curl_easy_cleanup(this->handle_);
    this->handle_ = (handle_t)0x0;
  }
  return;
}

Assistant:

void Close() {
            if (handle_) {
                RESTINCURL_LOG("Cleaning easy-handle " << handle_);
                curl_easy_cleanup(handle_);
                handle_ = nullptr;
            }
        }